

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O1

void __thiscall pg::SSPMSolver::stream_best(SSPMSolver *this,ostream *out,int h)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  if (*this->best_d == -1) {
    pcVar1 = " \x1b[1;33mTop\x1b[m";
    lVar4 = 0xe;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out," { ",3);
    if (0 < h) {
      iVar3 = 0;
      lVar4 = 0;
      do {
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        bVar5 = true;
        if ((int)lVar4 < this->l) {
          lVar4 = (long)(int)lVar4;
          iVar2 = 0;
          do {
            if (this->best_d[lVar4] != iVar3) goto LAB_0016fec6;
            iVar2 = iVar2 + 1;
            std::ostream::_M_insert<bool>(SUB81(out,0));
            lVar4 = lVar4 + 1;
          } while (lVar4 < this->l);
          iVar2 = 1;
LAB_0016fec6:
          bVar5 = iVar2 == 0;
        }
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>(out,anon_var_dwarf_27da90,2);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != h);
    }
    pcVar1 = " }";
    lVar4 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar1,lVar4);
  return;
}

Assistant:

void
SSPMSolver::stream_best(std::ostream &out, int h)
{
    if (best_d[0] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and best_d[j] == i) {
                c++;
                out << best_b[j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";
    }
}